

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
::operator()(CallDeleter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
             *this,_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_size_t
                   *deleter,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
            size_t size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t size_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_size_t
  *deleter_local;
  CallDeleter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  *this_local;
  
  if (deleter ==
      (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_size_t *)0x0
     ) {
    if (data != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = data + *(long *)(data + -8) * 0x20;
      while (data != this_00) {
        this_00 = this_00 + -0x20;
        std::__cxx11::string::~string((string *)this_00);
      }
      operator_delete__(data + -8);
    }
  }
  else {
    (*deleter)(data,size);
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }